

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int luv_tcp_connect(lua_State *L)

{
  int iVar1;
  uv_tcp_t *handle_00;
  char *ip;
  lua_Integer lVar2;
  uv_connect_t *req_00;
  luv_req_t *plVar3;
  int ref;
  int ret;
  uv_connect_t *req;
  sockaddr_storage addr;
  int port;
  char *host;
  uv_tcp_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_tcp(L,1);
  ip = luaL_checklstring(L,2,(size_t *)0x0);
  lVar2 = luaL_checkinteger(L,3);
  addr.__ss_align._4_4_ = (uint)lVar2;
  iVar1 = uv_ip4_addr(ip,addr.__ss_align._4_4_,(sockaddr_in *)&req);
  if ((iVar1 != 0) &&
     (iVar1 = uv_ip6_addr(ip,addr.__ss_align._4_4_,(sockaddr_in6 *)&req), iVar1 != 0)) {
    iVar1 = luaL_error(L,"Invalid IP address or port [%s:%d]",ip,(ulong)addr.__ss_align._4_4_);
    return iVar1;
  }
  iVar1 = luv_check_continuation(L,4);
  req_00 = (uv_connect_t *)lua_newuserdata(L,0x60);
  plVar3 = luv_setup_req(L,iVar1);
  req_00->data = plVar3;
  iVar1 = uv_tcp_connect(req_00,handle_00,(sockaddr *)&req,luv_connect_cb);
  if (iVar1 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req_00->data);
    lua_settop(L,-2);
    L_local._4_4_ = luv_error(L,iVar1);
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_tcp_connect(lua_State* L) {
  uv_tcp_t* handle = luv_check_tcp(L, 1);
  const char* host = luaL_checkstring(L, 2);
  int port = luaL_checkinteger(L, 3);
  struct sockaddr_storage addr;
  uv_connect_t* req;
  int ret, ref;
  luv_handle_t* lhandle = handle->data;
  if (uv_ip4_addr(host, port, (struct sockaddr_in*)&addr) &&
      uv_ip6_addr(host, port, (struct sockaddr_in6*)&addr)) {
    return luaL_error(L, "Invalid IP address or port [%s:%d]", host, port);
  }
  ref = luv_check_continuation(L, 4);

  req = (uv_connect_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, lhandle->ctx, ref);
  ret = uv_tcp_connect(req, handle, (struct sockaddr*)&addr, luv_connect_cb);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  return 1;
}